

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O2

void __thiscall
ParseTableCalculation::printItemSets
          (ParseTableCalculation *this,
          list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
          *item_sets)

{
  pointer pvVar1;
  int iVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  int i;
  ulong uVar5;
  long lVar6;
  _List_node_base *p_Var7;
  long lVar8;
  int iVar9;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Item sets");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar9 = 0;
  p_Var7 = (_List_node_base *)item_sets;
  while (p_Var7 = (((_List_base<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
                     *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)item_sets) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\tState [");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
    std::operator<<(poVar3,"]\n");
    for (p_Var4 = (_Rb_tree_node_base *)p_Var7[2]._M_prev;
        p_Var4 != (_Rb_tree_node_base *)&p_Var7[1]._M_prev;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::operator<<((ostream *)&std::cout,"\t\t");
      lVar8 = 0;
      uVar5 = 0;
      while( true ) {
        pvVar1 = (this->rules_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = *(long *)&pvVar1[(int)p_Var4[1]._M_color].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        iVar2 = (int)((ulong)((long)*(pointer *)
                                     ((long)&pvVar1[(int)p_Var4[1]._M_color].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data + 8) - lVar6) >> 5);
        if ((long)iVar2 <= (long)uVar5) break;
        if (uVar5 == *(uint *)&p_Var4[1].field_0x4) {
          std::operator<<((ostream *)&std::cout,".");
          lVar6 = *(long *)&(this->rules_).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)p_Var4[1]._M_color].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)(lVar6 + lVar8));
        std::operator<<(poVar3," ");
        uVar5 = uVar5 + 1;
        lVar8 = lVar8 + 0x20;
      }
      if (*(int *)&p_Var4[1].field_0x4 == iVar2) {
        std::operator<<((ostream *)&std::cout,".");
      }
      poVar3 = std::operator<<((ostream *)&std::cout," | ");
      poVar3 = std::operator<<(poVar3,(string *)&p_Var4[1]._M_parent);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar9 = iVar9 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void ParseTableCalculation::printItemSets(const std::list<std::set<Item>>& item_sets)
{
	int i = 0;
	std::cout << "Item sets" << std::endl;
	for (auto& set : item_sets)
	{
		std::cout << "\tState [" << i << "]\n";
		for (const Item& item : set)
		{
			std::cout << "\t\t";
			for (int i = 0; i < static_cast<int>(rules_[item.ruleIndex].size()); ++i)
			{
				if (i == item.dotPosition)
				{
					std::cout << ".";
				}
				std::cout << rules_[item.ruleIndex][i] << " ";
			}
			if (item.dotPosition == static_cast<int>(rules_[item.ruleIndex].size()))
			{
				std::cout << ".";
			}
			std::cout << " | " << item.lookahead << std::endl;
		}
		std::cout << std::endl;
		++i;
	}
	std::cout << std::endl;
}